

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O1

void av1_fwd_txfm2d_8x8_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int8_t *piVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  int iVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  __m256i out [8];
  __m256i in [8];
  __m256i local_260;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  __m256i local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  piVar4 = av1_fwd_txfm_shift_ls[1];
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    uVar5 = (uint)*av1_fwd_txfm_shift_ls[1];
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 5));
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    local_160 = (__m256i)vpslld_avx2(auVar11,ZEXT416(uVar5));
    local_140 = vpslld_avx2(auVar14,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_120 = vpslld_avx2(auVar16,auVar26);
    local_100 = vpslld_avx2(auVar18,auVar26);
    local_e0 = vpslld_avx2(auVar20,auVar26);
    local_c0 = vpslld_avx2(auVar22,auVar26);
    local_a0 = vpslld_avx2(auVar24,ZEXT416(uVar5));
    local_80 = vpslld_avx2(auVar9,ZEXT416(uVar5));
    fdct8_avx2(&local_160,&local_260,'\r',1,1);
    goto LAB_0042ae10;
  case 1:
    cVar2 = *av1_fwd_txfm_shift_ls[1];
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 5));
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    goto LAB_0042ad72;
  case 2:
    cVar2 = *av1_fwd_txfm_shift_ls[1];
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 5));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    goto LAB_0042b059;
  case 3:
    uVar5 = (uint)*av1_fwd_txfm_shift_ls[1];
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 5));
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    break;
  case 4:
    cVar2 = *av1_fwd_txfm_shift_ls[1];
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 5));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
LAB_0042ad72:
    uVar5 = (uint)cVar2;
    local_160 = (__m256i)vpslld_avx2(auVar14,ZEXT416(uVar5));
    local_140 = vpslld_avx2(auVar16,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_120 = vpslld_avx2(auVar18,auVar26);
    local_100 = vpslld_avx2(auVar20,auVar26);
    local_e0 = vpslld_avx2(auVar22,auVar26);
    local_c0 = vpslld_avx2(auVar24,auVar26);
    local_a0 = vpslld_avx2(auVar9,ZEXT416(uVar5));
    local_80 = vpslld_avx2(auVar11,ZEXT416(uVar5));
    fadst8_avx2(&local_160,&local_260,'\r',1,1);
LAB_0042ae10:
    iVar6 = 1 << (~piVar4[1] & 0x1fU);
    auVar8._4_4_ = iVar6;
    auVar8._0_4_ = iVar6;
    auVar8._8_4_ = iVar6;
    auVar8._12_4_ = iVar6;
    auVar8._16_4_ = iVar6;
    auVar8._20_4_ = iVar6;
    auVar8._24_4_ = iVar6;
    auVar8._28_4_ = iVar6;
    auVar11 = vpaddd_avx2(auVar8,(undefined1  [32])local_260);
    auVar14 = vpaddd_avx2(auVar8,local_240);
    auVar16 = vpaddd_avx2(auVar8,local_220);
    auVar18 = vpaddd_avx2(auVar8,local_200);
    auVar20 = vpaddd_avx2(auVar8,local_1e0);
    auVar22 = vpaddd_avx2(auVar8,local_1c0);
    auVar24 = vpaddd_avx2(auVar8,local_1a0);
    auVar9 = vpaddd_avx2(auVar8,local_180);
    uVar5 = -(int)piVar4[1];
    local_260 = (__m256i)vpsrad_avx2(auVar11,ZEXT416(uVar5));
    local_240 = vpsrad_avx2(auVar14,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_220 = vpsrad_avx2(auVar16,auVar26);
    local_200 = vpsrad_avx2(auVar18,auVar26);
    local_1e0 = vpsrad_avx2(auVar20,auVar26);
    local_1c0 = vpsrad_avx2(auVar22,auVar26);
    local_1a0 = vpsrad_avx2(auVar24,ZEXT416(uVar5));
    local_180 = vpsrad_avx2(auVar9,ZEXT416(uVar5));
    auVar20 = vpunpckldq_avx2((undefined1  [32])local_260,local_240);
    auVar11 = vpunpckhdq_avx2((undefined1  [32])local_260,local_240);
    auVar22 = vpunpckldq_avx2(local_220,local_200);
    auVar14 = vpunpckhdq_avx2(local_220,local_200);
    auVar24 = vpunpckldq_avx2(local_1e0,local_1c0);
    auVar16 = vpunpckhdq_avx2(local_1e0,local_1c0);
    auVar9 = vpunpckldq_avx2(local_1a0,local_180);
    auVar18 = vpunpckhdq_avx2(local_1a0,local_180);
    auVar7 = vpunpcklqdq_avx2(auVar20,auVar22);
    auVar10 = vpunpcklqdq_avx2(auVar24,auVar9);
    auVar26 = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar10._0_16_;
    local_160[2] = auVar26._0_8_;
    local_160._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar7._0_16_;
    local_160[3] = auVar26._8_8_;
    local_e0 = vperm2i128_avx2(auVar7,auVar10,0x31);
    auVar20 = vpunpckhqdq_avx2(auVar20,auVar22);
    auVar22 = vpunpckhqdq_avx2(auVar24,auVar9);
    local_140._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar20._0_16_;
    local_140._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar22._0_16_;
    local_c0 = vperm2i128_avx2(auVar20,auVar22,0x31);
    auVar20 = vpunpcklqdq_avx2(auVar11,auVar14);
    auVar22 = vpunpcklqdq_avx2(auVar16,auVar18);
    local_120._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar20._0_16_;
    local_120._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar22._0_16_;
    local_a0 = vperm2i128_avx2(auVar20,auVar22,0x31);
    auVar11 = vpunpckhqdq_avx2(auVar11,auVar14);
    auVar14 = vpunpckhqdq_avx2(auVar16,auVar18);
    local_100._0_16_ = ZEXT116(0) * auVar14._0_16_ + ZEXT116(1) * auVar11._0_16_;
    local_100._16_16_ = ZEXT116(0) * auVar11._16_16_ + ZEXT116(1) * auVar14._0_16_;
    local_80 = vperm2i128_avx2(auVar11,auVar14,0x31);
LAB_0042af86:
    fdct8_avx2(&local_160,&local_260,'\r',1,1);
    goto LAB_0042b961;
  case 5:
    cVar2 = *av1_fwd_txfm_shift_ls[1];
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])input,_DAT_0052a4a0);
    auVar9 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride),_DAT_0052a4a0);
    auVar24 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 2),_DAT_0052a4a0);
    auVar18 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 3),_DAT_0052a4a0);
    auVar16 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 4),_DAT_0052a4a0);
    auVar14 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 5),_DAT_0052a4a0);
    auVar11 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 6),_DAT_0052a4a0);
    auVar22 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 7),_DAT_0052a4a0);
    auVar20 = vpmovsxwd_avx2(auVar26);
LAB_0042b059:
    uVar5 = (uint)cVar2;
    local_160 = (__m256i)vpslld_avx2(auVar9,ZEXT416(uVar5));
    local_140 = vpslld_avx2(auVar24,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_120 = vpslld_avx2(auVar18,auVar26);
    local_100 = vpslld_avx2(auVar16,auVar26);
    local_e0 = vpslld_avx2(auVar14,auVar26);
    local_c0 = vpslld_avx2(auVar11,auVar26);
    local_a0 = vpslld_avx2(auVar22,ZEXT416(uVar5));
    local_80 = vpslld_avx2(auVar20,ZEXT416(uVar5));
    fdct8_avx2(&local_160,&local_260,'\r',1,1);
    goto LAB_0042b7d8;
  case 6:
    cVar2 = *av1_fwd_txfm_shift_ls[1];
    auVar26 = *(undefined1 (*) [16])(input + stride * 7);
    auVar13 = *(undefined1 (*) [16])(input + stride * 6);
    auVar15 = *(undefined1 (*) [16])(input + stride * 5);
    auVar17 = *(undefined1 (*) [16])(input + stride * 4);
    auVar19 = *(undefined1 (*) [16])(input + stride * 3);
    auVar21 = *(undefined1 (*) [16])(input + stride * 2);
    auVar23 = *(undefined1 (*) [16])(input + stride);
    auVar25 = *(undefined1 (*) [16])input;
    goto LAB_0042b3f1;
  case 7:
    cVar2 = *av1_fwd_txfm_shift_ls[1];
    auVar26 = *(undefined1 (*) [16])input;
    auVar13 = *(undefined1 (*) [16])(input + stride);
    auVar15 = *(undefined1 (*) [16])(input + stride * 2);
    auVar17 = *(undefined1 (*) [16])(input + stride * 3);
    auVar19 = *(undefined1 (*) [16])(input + stride * 4);
    auVar21 = *(undefined1 (*) [16])(input + stride * 5);
    auVar23 = *(undefined1 (*) [16])(input + stride * 6);
    auVar25 = *(undefined1 (*) [16])(input + stride * 7);
LAB_0042b3f1:
    uVar5 = (uint)cVar2;
    auVar26 = vpshufb_avx(auVar26,_DAT_0052a4a0);
    auVar11 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(auVar13,_DAT_0052a4a0);
    auVar14 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(auVar15,_DAT_0052a4a0);
    auVar16 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(auVar17,_DAT_0052a4a0);
    auVar18 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(auVar19,_DAT_0052a4a0);
    auVar20 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(auVar21,_DAT_0052a4a0);
    auVar22 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(auVar23,_DAT_0052a4a0);
    auVar24 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(auVar25,_DAT_0052a4a0);
    auVar9 = vpmovsxwd_avx2(auVar26);
    break;
  case 8:
    uVar5 = (uint)*av1_fwd_txfm_shift_ls[1];
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 5));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
    break;
  case 9:
    iVar6 = stride * 5;
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + iVar6));
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    uVar5 = (uint)*av1_fwd_txfm_shift_ls[1];
    local_160 = (__m256i)vpslld_avx2(auVar11,ZEXT416(uVar5));
    local_140 = vpslld_avx2(auVar14,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_120 = vpslld_avx2(auVar16,auVar26);
    local_100 = vpslld_avx2(auVar18,auVar26);
    local_e0 = vpslld_avx2(auVar20,auVar26);
    local_c0 = vpslld_avx2(auVar22,auVar26);
    local_a0 = vpslld_avx2(auVar24,ZEXT416(uVar5));
    local_80 = vpslld_avx2(auVar9,ZEXT416(uVar5));
    idtx8_avx2(&local_160,&local_260,'\0',1,iVar6);
    goto LAB_0042b556;
  case 10:
    uVar5 = (uint)*av1_fwd_txfm_shift_ls[1];
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 5));
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    local_160 = (__m256i)vpslld_avx2(auVar11,ZEXT416(uVar5));
    local_140 = vpslld_avx2(auVar14,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_120 = vpslld_avx2(auVar16,auVar26);
    local_100 = vpslld_avx2(auVar18,auVar26);
    local_e0 = vpslld_avx2(auVar20,auVar26);
    local_c0 = vpslld_avx2(auVar22,auVar26);
    local_a0 = vpslld_avx2(auVar24,ZEXT416(uVar5));
    local_80 = vpslld_avx2(auVar9,ZEXT416(uVar5));
    iVar6 = 1;
    fdct8_avx2(&local_160,&local_260,'\r',1,1);
LAB_0042b556:
    bVar1 = piVar4[1];
LAB_0042b567:
    iVar3 = 1 << (~bVar1 & 0x1f);
    auVar10._4_4_ = iVar3;
    auVar10._0_4_ = iVar3;
    auVar10._8_4_ = iVar3;
    auVar10._12_4_ = iVar3;
    auVar10._16_4_ = iVar3;
    auVar10._20_4_ = iVar3;
    auVar10._24_4_ = iVar3;
    auVar10._28_4_ = iVar3;
    auVar11 = vpaddd_avx2(auVar10,(undefined1  [32])local_260);
    auVar14 = vpaddd_avx2(auVar10,local_240);
    auVar16 = vpaddd_avx2(auVar10,local_220);
    auVar18 = vpaddd_avx2(auVar10,local_200);
    auVar20 = vpaddd_avx2(auVar10,local_1e0);
    auVar22 = vpaddd_avx2(auVar10,local_1c0);
    auVar24 = vpaddd_avx2(auVar10,local_1a0);
    uVar5 = -(int)(char)bVar1;
    auVar9 = vpaddd_avx2(auVar10,local_180);
    local_260 = (__m256i)vpsrad_avx2(auVar11,ZEXT416(uVar5));
    local_240 = vpsrad_avx2(auVar14,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_220 = vpsrad_avx2(auVar16,auVar26);
    local_200 = vpsrad_avx2(auVar18,auVar26);
    local_1e0 = vpsrad_avx2(auVar20,auVar26);
    local_1c0 = vpsrad_avx2(auVar22,auVar26);
    local_1a0 = vpsrad_avx2(auVar24,ZEXT416(uVar5));
    local_180 = vpsrad_avx2(auVar9,ZEXT416(uVar5));
    auVar20 = vpunpckldq_avx2((undefined1  [32])local_260,local_240);
    auVar11 = vpunpckhdq_avx2((undefined1  [32])local_260,local_240);
    auVar22 = vpunpckldq_avx2(local_220,local_200);
    auVar14 = vpunpckhdq_avx2(local_220,local_200);
    auVar24 = vpunpckldq_avx2(local_1e0,local_1c0);
    auVar16 = vpunpckhdq_avx2(local_1e0,local_1c0);
    auVar9 = vpunpckldq_avx2(local_1a0,local_180);
    auVar18 = vpunpckhdq_avx2(local_1a0,local_180);
    auVar7 = vpunpcklqdq_avx2(auVar20,auVar22);
    auVar10 = vpunpcklqdq_avx2(auVar24,auVar9);
    auVar26 = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar10._0_16_;
    local_160[2] = auVar26._0_8_;
    local_160._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar7._0_16_;
    local_160[3] = auVar26._8_8_;
    local_e0 = vperm2i128_avx2(auVar7,auVar10,0x31);
    auVar20 = vpunpckhqdq_avx2(auVar20,auVar22);
    auVar22 = vpunpckhqdq_avx2(auVar24,auVar9);
    local_140._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar20._0_16_;
    local_140._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar22._0_16_;
    local_c0 = vperm2i128_avx2(auVar20,auVar22,0x31);
    auVar20 = vpunpcklqdq_avx2(auVar11,auVar14);
    auVar22 = vpunpcklqdq_avx2(auVar16,auVar18);
    local_120._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar20._0_16_;
    local_120._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar22._0_16_;
    local_a0 = vperm2i128_avx2(auVar20,auVar22,0x31);
    auVar11 = vpunpckhqdq_avx2(auVar11,auVar14);
    auVar14 = vpunpckhqdq_avx2(auVar16,auVar18);
    local_100._0_16_ = ZEXT116(0) * auVar14._0_16_ + ZEXT116(1) * auVar11._0_16_;
    local_100._16_16_ = ZEXT116(0) * auVar11._16_16_ + ZEXT116(1) * auVar14._0_16_;
    local_80 = vperm2i128_avx2(auVar11,auVar14,0x31);
    idtx8_avx2(&local_160,&local_260,'\0',1,iVar6);
    goto LAB_0042b961;
  case 0xb:
    uVar5 = (uint)*av1_fwd_txfm_shift_ls[1];
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 5));
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    local_160 = (__m256i)vpslld_avx2(auVar11,ZEXT416(uVar5));
    local_140 = vpslld_avx2(auVar14,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_120 = vpslld_avx2(auVar16,auVar26);
    local_100 = vpslld_avx2(auVar18,auVar26);
    local_e0 = vpslld_avx2(auVar20,auVar26);
    local_c0 = vpslld_avx2(auVar22,auVar26);
    local_a0 = vpslld_avx2(auVar24,ZEXT416(uVar5));
    local_80 = vpslld_avx2(auVar9,ZEXT416(uVar5));
    idtx8_avx2(&local_160,&local_260,'\0',1,stride * 4);
    iVar6 = 1 << (~piVar4[1] & 0x1fU);
    auVar7._4_4_ = iVar6;
    auVar7._0_4_ = iVar6;
    auVar7._8_4_ = iVar6;
    auVar7._12_4_ = iVar6;
    auVar7._16_4_ = iVar6;
    auVar7._20_4_ = iVar6;
    auVar7._24_4_ = iVar6;
    auVar7._28_4_ = iVar6;
    auVar11 = vpaddd_avx2(auVar7,(undefined1  [32])local_260);
    auVar14 = vpaddd_avx2(auVar7,local_240);
    auVar16 = vpaddd_avx2(auVar7,local_220);
    auVar18 = vpaddd_avx2(auVar7,local_200);
    auVar20 = vpaddd_avx2(auVar7,local_1e0);
    auVar22 = vpaddd_avx2(auVar7,local_1c0);
    auVar24 = vpaddd_avx2(auVar7,local_1a0);
    uVar5 = -(int)piVar4[1];
    auVar9 = vpaddd_avx2(auVar7,local_180);
    local_260 = (__m256i)vpsrad_avx2(auVar11,ZEXT416(uVar5));
    local_240 = vpsrad_avx2(auVar14,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_220 = vpsrad_avx2(auVar16,auVar26);
    local_200 = vpsrad_avx2(auVar18,auVar26);
    local_1e0 = vpsrad_avx2(auVar20,auVar26);
    local_1c0 = vpsrad_avx2(auVar22,auVar26);
    local_1a0 = vpsrad_avx2(auVar24,ZEXT416(uVar5));
    local_180 = vpsrad_avx2(auVar9,ZEXT416(uVar5));
    auVar20 = vpunpckldq_avx2((undefined1  [32])local_260,local_240);
    auVar11 = vpunpckhdq_avx2((undefined1  [32])local_260,local_240);
    auVar22 = vpunpckldq_avx2(local_220,local_200);
    auVar14 = vpunpckhdq_avx2(local_220,local_200);
    auVar24 = vpunpckldq_avx2(local_1e0,local_1c0);
    auVar16 = vpunpckhdq_avx2(local_1e0,local_1c0);
    auVar9 = vpunpckldq_avx2(local_1a0,local_180);
    auVar18 = vpunpckhdq_avx2(local_1a0,local_180);
    auVar7 = vpunpcklqdq_avx2(auVar20,auVar22);
    auVar10 = vpunpcklqdq_avx2(auVar24,auVar9);
    auVar26 = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar10._0_16_;
    local_160[2] = auVar26._0_8_;
    local_160._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar7._0_16_;
    local_160[3] = auVar26._8_8_;
    local_e0 = vperm2i128_avx2(auVar7,auVar10,0x31);
    auVar20 = vpunpckhqdq_avx2(auVar20,auVar22);
    auVar22 = vpunpckhqdq_avx2(auVar24,auVar9);
    local_140._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar20._0_16_;
    local_140._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar22._0_16_;
    local_c0 = vperm2i128_avx2(auVar20,auVar22,0x31);
    auVar20 = vpunpcklqdq_avx2(auVar11,auVar14);
    auVar22 = vpunpcklqdq_avx2(auVar16,auVar18);
    local_120._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar20._0_16_;
    local_120._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar22._0_16_;
    local_a0 = vperm2i128_avx2(auVar20,auVar22,0x31);
    auVar11 = vpunpckhqdq_avx2(auVar11,auVar14);
    auVar14 = vpunpckhqdq_avx2(auVar16,auVar18);
    local_100._0_16_ = ZEXT116(0) * auVar14._0_16_ + ZEXT116(1) * auVar11._0_16_;
    local_100._16_16_ = ZEXT116(0) * auVar11._16_16_ + ZEXT116(1) * auVar14._0_16_;
    local_80 = vperm2i128_avx2(auVar11,auVar14,0x31);
    goto LAB_0042af86;
  case 0xc:
    cVar2 = *av1_fwd_txfm_shift_ls[1];
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 5));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    goto LAB_0042a94f;
  case 0xd:
    cVar2 = *av1_fwd_txfm_shift_ls[1];
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 5));
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    goto LAB_0042b166;
  case 0xe:
    cVar2 = *av1_fwd_txfm_shift_ls[1];
    auVar9 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 7));
    auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 6));
    auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 5));
    auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 4));
    auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 3));
    auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride * 2));
    auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(input + stride));
    auVar24 = vpmovsxwd_avx2(*(undefined1 (*) [16])input);
LAB_0042a94f:
    uVar5 = (uint)cVar2;
    local_160 = (__m256i)vpslld_avx2(auVar9,ZEXT416(uVar5));
    local_140 = vpslld_avx2(auVar11,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_120 = vpslld_avx2(auVar14,auVar26);
    local_100 = vpslld_avx2(auVar16,auVar26);
    local_e0 = vpslld_avx2(auVar18,auVar26);
    local_c0 = vpslld_avx2(auVar20,auVar26);
    local_a0 = vpslld_avx2(auVar22,ZEXT416(uVar5));
    local_80 = vpslld_avx2(auVar24,ZEXT416(uVar5));
    iVar6 = 1;
    fadst8_avx2(&local_160,&local_260,'\r',1,1);
    bVar1 = piVar4[1];
    goto LAB_0042b567;
  case 0xf:
    cVar2 = *av1_fwd_txfm_shift_ls[1];
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])input,_DAT_0052a4a0);
    auVar9 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride),_DAT_0052a4a0);
    auVar11 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 2),_DAT_0052a4a0);
    auVar24 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 3),_DAT_0052a4a0);
    auVar22 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 4),_DAT_0052a4a0);
    auVar20 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 5),_DAT_0052a4a0);
    auVar18 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 6),_DAT_0052a4a0);
    auVar16 = vpmovsxwd_avx2(auVar26);
    auVar26 = vpshufb_avx(*(undefined1 (*) [16])(input + stride * 7),_DAT_0052a4a0);
    auVar14 = vpmovsxwd_avx2(auVar26);
LAB_0042b166:
    uVar5 = (uint)cVar2;
    local_160 = (__m256i)vpslld_avx2(auVar9,ZEXT416(uVar5));
    local_140 = vpslld_avx2(auVar11,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_120 = vpslld_avx2(auVar24,auVar26);
    local_100 = vpslld_avx2(auVar22,auVar26);
    local_e0 = vpslld_avx2(auVar20,auVar26);
    local_c0 = vpslld_avx2(auVar18,auVar26);
    local_a0 = vpslld_avx2(auVar16,ZEXT416(uVar5));
    local_80 = vpslld_avx2(auVar14,ZEXT416(uVar5));
    idtx8_avx2(&local_160,&local_260,'\0',1,stride * 4);
    iVar6 = 1 << (~piVar4[1] & 0x1fU);
    auVar9._4_4_ = iVar6;
    auVar9._0_4_ = iVar6;
    auVar9._8_4_ = iVar6;
    auVar9._12_4_ = iVar6;
    auVar9._16_4_ = iVar6;
    auVar9._20_4_ = iVar6;
    auVar9._24_4_ = iVar6;
    auVar9._28_4_ = iVar6;
    auVar11 = vpaddd_avx2(auVar9,(undefined1  [32])local_260);
    auVar14 = vpaddd_avx2(auVar9,local_240);
    auVar16 = vpaddd_avx2(auVar9,local_220);
    auVar18 = vpaddd_avx2(auVar9,local_200);
    auVar20 = vpaddd_avx2(auVar9,local_1e0);
    auVar22 = vpaddd_avx2(auVar9,local_1c0);
    auVar24 = vpaddd_avx2(auVar9,local_1a0);
    uVar5 = -(int)piVar4[1];
    auVar9 = vpaddd_avx2(auVar9,local_180);
    local_260 = (__m256i)vpsrad_avx2(auVar11,ZEXT416(uVar5));
    local_240 = vpsrad_avx2(auVar14,ZEXT416(uVar5));
    auVar26 = ZEXT416(uVar5);
    local_220 = vpsrad_avx2(auVar16,auVar26);
    local_200 = vpsrad_avx2(auVar18,auVar26);
    local_1e0 = vpsrad_avx2(auVar20,auVar26);
    local_1c0 = vpsrad_avx2(auVar22,auVar26);
    local_1a0 = vpsrad_avx2(auVar24,ZEXT416(uVar5));
    local_180 = vpsrad_avx2(auVar9,ZEXT416(uVar5));
    auVar20 = vpunpckldq_avx2((undefined1  [32])local_260,local_240);
    auVar11 = vpunpckhdq_avx2((undefined1  [32])local_260,local_240);
    auVar22 = vpunpckldq_avx2(local_220,local_200);
    auVar14 = vpunpckhdq_avx2(local_220,local_200);
    auVar24 = vpunpckldq_avx2(local_1e0,local_1c0);
    auVar16 = vpunpckhdq_avx2(local_1e0,local_1c0);
    auVar9 = vpunpckldq_avx2(local_1a0,local_180);
    auVar18 = vpunpckhdq_avx2(local_1a0,local_180);
    auVar7 = vpunpcklqdq_avx2(auVar20,auVar22);
    auVar10 = vpunpcklqdq_avx2(auVar24,auVar9);
    auVar26 = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar10._0_16_;
    local_160[2] = auVar26._0_8_;
    local_160._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar7._0_16_;
    local_160[3] = auVar26._8_8_;
    local_e0 = vperm2i128_avx2(auVar7,auVar10,0x31);
    auVar20 = vpunpckhqdq_avx2(auVar20,auVar22);
    auVar22 = vpunpckhqdq_avx2(auVar24,auVar9);
    local_140._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar20._0_16_;
    local_140._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar22._0_16_;
    local_c0 = vperm2i128_avx2(auVar20,auVar22,0x31);
    auVar20 = vpunpcklqdq_avx2(auVar11,auVar14);
    auVar22 = vpunpcklqdq_avx2(auVar16,auVar18);
    local_120._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar20._0_16_;
    local_120._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar22._0_16_;
    local_a0 = vperm2i128_avx2(auVar20,auVar22,0x31);
    auVar11 = vpunpckhqdq_avx2(auVar11,auVar14);
    auVar14 = vpunpckhqdq_avx2(auVar16,auVar18);
    local_100._0_16_ = ZEXT116(0) * auVar14._0_16_ + ZEXT116(1) * auVar11._0_16_;
    local_100._16_16_ = ZEXT116(0) * auVar11._16_16_ + ZEXT116(1) * auVar14._0_16_;
    local_80 = vperm2i128_avx2(auVar11,auVar14,0x31);
    goto LAB_0042b94e;
  default:
    goto switchD_0042a473_default;
  }
  local_160 = (__m256i)vpslld_avx2(auVar11,ZEXT416(uVar5));
  local_140 = vpslld_avx2(auVar14,ZEXT416(uVar5));
  auVar26 = ZEXT416(uVar5);
  local_120 = vpslld_avx2(auVar16,auVar26);
  local_100 = vpslld_avx2(auVar18,auVar26);
  local_e0 = vpslld_avx2(auVar20,auVar26);
  local_c0 = vpslld_avx2(auVar22,auVar26);
  local_a0 = vpslld_avx2(auVar24,ZEXT416(uVar5));
  local_80 = vpslld_avx2(auVar9,ZEXT416(uVar5));
  fadst8_avx2(&local_160,&local_260,'\r',1,1);
LAB_0042b7d8:
  iVar6 = 1 << (~piVar4[1] & 0x1fU);
  auVar12._4_4_ = iVar6;
  auVar12._0_4_ = iVar6;
  auVar12._8_4_ = iVar6;
  auVar12._12_4_ = iVar6;
  auVar12._16_4_ = iVar6;
  auVar12._20_4_ = iVar6;
  auVar12._24_4_ = iVar6;
  auVar12._28_4_ = iVar6;
  auVar11 = vpaddd_avx2(auVar12,(undefined1  [32])local_260);
  auVar14 = vpaddd_avx2(auVar12,local_240);
  auVar16 = vpaddd_avx2(auVar12,local_220);
  auVar18 = vpaddd_avx2(auVar12,local_200);
  auVar20 = vpaddd_avx2(auVar12,local_1e0);
  auVar22 = vpaddd_avx2(auVar12,local_1c0);
  auVar24 = vpaddd_avx2(auVar12,local_1a0);
  auVar9 = vpaddd_avx2(auVar12,local_180);
  uVar5 = -(int)piVar4[1];
  local_260 = (__m256i)vpsrad_avx2(auVar11,ZEXT416(uVar5));
  local_240 = vpsrad_avx2(auVar14,ZEXT416(uVar5));
  auVar26 = ZEXT416(uVar5);
  local_220 = vpsrad_avx2(auVar16,auVar26);
  local_200 = vpsrad_avx2(auVar18,auVar26);
  local_1e0 = vpsrad_avx2(auVar20,auVar26);
  local_1c0 = vpsrad_avx2(auVar22,auVar26);
  local_1a0 = vpsrad_avx2(auVar24,ZEXT416(uVar5));
  local_180 = vpsrad_avx2(auVar9,ZEXT416(uVar5));
  auVar20 = vpunpckldq_avx2((undefined1  [32])local_260,local_240);
  auVar11 = vpunpckhdq_avx2((undefined1  [32])local_260,local_240);
  auVar22 = vpunpckldq_avx2(local_220,local_200);
  auVar14 = vpunpckhdq_avx2(local_220,local_200);
  auVar24 = vpunpckldq_avx2(local_1e0,local_1c0);
  auVar16 = vpunpckhdq_avx2(local_1e0,local_1c0);
  auVar9 = vpunpckldq_avx2(local_1a0,local_180);
  auVar18 = vpunpckhdq_avx2(local_1a0,local_180);
  auVar7 = vpunpcklqdq_avx2(auVar20,auVar22);
  auVar10 = vpunpcklqdq_avx2(auVar24,auVar9);
  auVar26 = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar10._0_16_;
  local_160[2] = auVar26._0_8_;
  local_160._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar7._0_16_;
  local_160[3] = auVar26._8_8_;
  local_e0 = vperm2i128_avx2(auVar7,auVar10,0x31);
  auVar20 = vpunpckhqdq_avx2(auVar20,auVar22);
  auVar22 = vpunpckhqdq_avx2(auVar24,auVar9);
  local_140._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar20._0_16_;
  local_140._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar22._0_16_;
  local_c0 = vperm2i128_avx2(auVar20,auVar22,0x31);
  auVar20 = vpunpcklqdq_avx2(auVar11,auVar14);
  auVar22 = vpunpcklqdq_avx2(auVar16,auVar18);
  local_120._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar20._0_16_;
  local_120._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar22._0_16_;
  local_a0 = vperm2i128_avx2(auVar20,auVar22,0x31);
  auVar11 = vpunpckhqdq_avx2(auVar11,auVar14);
  auVar14 = vpunpckhqdq_avx2(auVar16,auVar18);
  local_100._0_16_ = ZEXT116(0) * auVar14._0_16_ + ZEXT116(1) * auVar11._0_16_;
  local_100._16_16_ = ZEXT116(0) * auVar11._16_16_ + ZEXT116(1) * auVar14._0_16_;
  local_80 = vperm2i128_avx2(auVar11,auVar14,0x31);
LAB_0042b94e:
  fadst8_avx2(&local_160,&local_260,'\r',1,1);
LAB_0042b961:
  memcpy(coeff,local_260,0x100);
switchD_0042a473_default:
  return;
}

Assistant:

void av1_fwd_txfm2d_8x8_avx2(const int16_t *input, int32_t *coeff, int stride,
                             TX_TYPE tx_type, int bd) {
  __m256i in[8], out[8];
  const TX_SIZE tx_size = TX_8X8;
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int width = tx_size_wide[tx_size];
  const int width_div8 = (width >> 3);

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case ADST_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case DCT_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case ADST_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case FLIPADST_DCT:
      load_buffer_8x8_avx2(input, in, stride, 1, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case DCT_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 1, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 1, 1, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case ADST_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 1, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case FLIPADST_ADST:
      load_buffer_8x8_avx2(input, in, stride, 1, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case IDTX:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case V_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case H_DCT:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fdct8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case V_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case H_ADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 0, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case V_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 1, 0, shift[0]);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    case H_FLIPADST:
      load_buffer_8x8_avx2(input, in, stride, 0, 1, shift[0]);
      idtx8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                 width_div8);
      col_txfm_8x8_rounding(out, -shift[1]);
      fwd_txfm_transpose_8x8_avx2(out, in, width_div8, width_div8);
      fadst8_avx2(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], width_div8,
                  width_div8);
      store_buffer_avx2(out, coeff, 8, 8);
      break;
    default: assert(0);
  }
  (void)bd;
}